

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_diag.c
# Opt level: O0

char * CVDiagGetReturnFlagName(long flag)

{
  char *__s;
  long in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1e);
  if (in_RDI == -0x65) {
    sprintf(__s,"CVDIAG_NO_ADJ");
  }
  else if (in_RDI == -7) {
    sprintf(__s,"CVDIAG_RHSFUNC_RECVR");
  }
  else if (in_RDI == -6) {
    sprintf(__s,"CVDIAG_RHSFUNC_UNRECVR");
  }
  else if (in_RDI == -5) {
    sprintf(__s,"CVDIAG_INV_FAIL");
  }
  else if (in_RDI == -4) {
    sprintf(__s,"CVDIAG_MEM_FAIL");
  }
  else if (in_RDI == -3) {
    sprintf(__s,"CVDIAG_ILL_INPUT");
  }
  else if (in_RDI == -2) {
    sprintf(__s,"CVDIAG_LMEM_NULL");
  }
  else if (in_RDI == -1) {
    sprintf(__s,"CVDIAG_MEM_NULL");
  }
  else if (in_RDI == 0) {
    sprintf(__s,"CVDIAG_SUCCESS");
  }
  else {
    sprintf(__s,"NONE");
  }
  return __s;
}

Assistant:

char* CVDiagGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case CVDIAG_SUCCESS: sprintf(name, "CVDIAG_SUCCESS"); break;
  case CVDIAG_MEM_NULL: sprintf(name, "CVDIAG_MEM_NULL"); break;
  case CVDIAG_LMEM_NULL: sprintf(name, "CVDIAG_LMEM_NULL"); break;
  case CVDIAG_ILL_INPUT: sprintf(name, "CVDIAG_ILL_INPUT"); break;
  case CVDIAG_MEM_FAIL: sprintf(name, "CVDIAG_MEM_FAIL"); break;
  case CVDIAG_INV_FAIL: sprintf(name, "CVDIAG_INV_FAIL"); break;
  case CVDIAG_RHSFUNC_UNRECVR: sprintf(name, "CVDIAG_RHSFUNC_UNRECVR"); break;
  case CVDIAG_RHSFUNC_RECVR: sprintf(name, "CVDIAG_RHSFUNC_RECVR"); break;
  case CVDIAG_NO_ADJ: sprintf(name, "CVDIAG_NO_ADJ"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}